

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitCompoundLiteralExpression
          (SyntaxDumper *this,CompoundLiteralExpressionSyntax *node)

{
  TypeNameSyntax *pTVar1;
  InitializerSyntax *pIVar2;
  SyntaxToken local_98;
  SyntaxToken local_50;
  CompoundLiteralExpressionSyntax *local_18;
  CompoundLiteralExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (CompoundLiteralExpressionSyntax *)this;
  CompoundLiteralExpressionSyntax::openParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  pTVar1 = CompoundLiteralExpressionSyntax::typeName(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pTVar1);
  CompoundLiteralExpressionSyntax::closeParenthesisToken(&local_98,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_98,local_18);
  SyntaxToken::~SyntaxToken(&local_98);
  pIVar2 = CompoundLiteralExpressionSyntax::initializer(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pIVar2);
  return Skip;
}

Assistant:

virtual Action visitCompoundLiteralExpression(const CompoundLiteralExpressionSyntax* node) override
    {
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->typeName());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->initializer());
        return Action::Skip;
    }